

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereClauseInsert(WhereClause *pWC,Expr *p,u16 wtFlags)

{
  WhereInfo *pWVar1;
  sqlite3 *db;
  LogEst LVar2;
  WhereMemBlock *pWVar3;
  u64 uVar4;
  WhereTerm *pWVar5;
  ExprList_item *pEVar6;
  int iVar7;
  
  iVar7 = pWC->nTerm;
  if (pWC->nSlot <= iVar7) {
    pWVar1 = pWC->pWInfo;
    pWVar5 = pWC->a;
    db = pWVar1->pParse->db;
    uVar4 = (long)pWC->nSlot * 0x70;
    pWVar3 = (WhereMemBlock *)sqlite3DbMallocRawNN(db,uVar4 + 0x10);
    if (pWVar3 == (WhereMemBlock *)0x0) {
      pWC->a = (WhereTerm *)0x0;
      if (p != (Expr *)0x0 && (wtFlags & 1) != 0) {
        sqlite3ExprDeleteNN(db,p);
      }
      pWC->a = pWVar5;
      return 0;
    }
    pWVar3->pNext = pWVar1->pMemToFree;
    pWVar3->sz = uVar4;
    pWVar1->pMemToFree = pWVar3;
    pWC->a = (WhereTerm *)(pWVar3 + 1);
    memcpy((WhereTerm *)(pWVar3 + 1),pWVar5,(long)pWC->nTerm * 0x38);
    pWC->nSlot = pWC->nSlot << 1;
    iVar7 = pWC->nTerm;
  }
  pWC->nTerm = iVar7 + 1;
  if ((wtFlags & 2) == 0) {
    pWC->nBase = iVar7 + 1;
  }
  pWVar5 = pWC->a + iVar7;
  if (p == (Expr *)0x0) {
    pWVar5->truthProb = 1;
  }
  else if ((p->flags & 0x80000) == 0) {
    pWVar5->truthProb = 1;
    do {
      if ((p->flags & 0x82000) == 0) goto LAB_0019767e;
      if ((p->flags >> 0x13 & 1) == 0) {
        if (p->op != 'r') goto LAB_0019767e;
        pEVar6 = (ExprList_item *)&p->pLeft;
      }
      else {
        pEVar6 = ((p->x).pList)->a;
      }
      p = pEVar6->pExpr;
    } while (p != (Expr *)0x0);
  }
  else {
    LVar2 = sqlite3LogEst((long)p->iTable);
    pWVar5->truthProb = LVar2 + -0x10e;
    do {
      if ((p->flags & 0x82000) == 0) goto LAB_0019767e;
      if ((p->flags >> 0x13 & 1) == 0) {
        if (p->op != 'r') goto LAB_0019767e;
        pEVar6 = (ExprList_item *)&p->pLeft;
      }
      else {
        pEVar6 = ((p->x).pList)->a;
      }
      p = pEVar6->pExpr;
    } while (p != (Expr *)0x0);
  }
  p = (Expr *)0x0;
LAB_0019767e:
  pWVar5->pExpr = p;
  pWVar5->wtFlags = wtFlags;
  pWVar5->pWC = pWC;
  pWVar5->eOperator = 0;
  pWVar5->nChild = '\0';
  pWVar5->eMatchOp = '\0';
  pWVar5->iParent = 0;
  *(undefined8 *)&pWVar5->leftCursor = 0;
  *(undefined8 *)((long)&pWVar5->u + 4) = 0;
  *(undefined8 *)((long)&pWVar5->prereqRight + 4) = 0;
  *(undefined4 *)((long)&pWVar5->prereqAll + 4) = 0;
  return iVar7;
}

Assistant:

static int whereClauseInsert(WhereClause *pWC, Expr *p, u16 wtFlags){
  WhereTerm *pTerm;
  int idx;
  testcase( wtFlags & TERM_VIRTUAL );
  if( pWC->nTerm>=pWC->nSlot ){
    WhereTerm *pOld = pWC->a;
    sqlite3 *db = pWC->pWInfo->pParse->db;
    pWC->a = sqlite3WhereMalloc(pWC->pWInfo, sizeof(pWC->a[0])*pWC->nSlot*2 );
    if( pWC->a==0 ){
      if( wtFlags & TERM_DYNAMIC ){
        sqlite3ExprDelete(db, p);
      }
      pWC->a = pOld;
      return 0;
    }
    memcpy(pWC->a, pOld, sizeof(pWC->a[0])*pWC->nTerm);
    pWC->nSlot = pWC->nSlot*2;
  }
  pTerm = &pWC->a[idx = pWC->nTerm++];
  if( (wtFlags & TERM_VIRTUAL)==0 ) pWC->nBase = pWC->nTerm;
  if( p && ExprHasProperty(p, EP_Unlikely) ){
    pTerm->truthProb = sqlite3LogEst(p->iTable) - 270;
  }else{
    pTerm->truthProb = 1;
  }
  pTerm->pExpr = sqlite3ExprSkipCollateAndLikely(p);
  pTerm->wtFlags = wtFlags;
  pTerm->pWC = pWC;
  pTerm->iParent = -1;
  memset(&pTerm->eOperator, 0,
         sizeof(WhereTerm) - offsetof(WhereTerm,eOperator));
  return idx;
}